

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QtPrivate::QColorShower::QColorShower(QColorShower *this,QColorDialog *parent)

{
  QColSpinBox *pQVar1;
  QLineEdit *pQVar2;
  int left;
  QGridLayout *this_00;
  QColorShowLabel *pQVar3;
  undefined4 *puVar4;
  QSpinBox *pQVar5;
  QLabel *pQVar6;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_01;
  QRegularExpressionValidator *this_02;
  long in_FS_OFFSET;
  QAnyStringView QVar7;
  Connection local_b8;
  QObject local_b0 [8];
  QObject local_a8 [8];
  QObject local_a0 [8];
  QObject local_98 [8];
  QObject local_90 [8];
  QObject local_88 [8];
  QObject local_80 [8];
  QArrayData *local_78;
  char16_t *local_70;
  undefined8 local_68;
  QRegularExpression regExp;
  QObject local_58 [8];
  code *local_50;
  ImplFn local_48;
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::QWidget(&this->super_QWidget,(QWidget *)parent,(WindowFlags)0x0);
  *(undefined8 *)&this->super_QWidget = 0x7fff00;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QColorShower_008000b0;
  (this->curQColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->curQColor).ct + 2) = 0;
  this->colorDialog = parent;
  this->curCol = 0xffffffff;
  (this->curQColor).cspec = Invalid;
  QColor::operator=(&this->curQColor,white);
  this_00 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_00,&this->super_QWidget);
  this->gl = this_00;
  left = (**(code **)(*(long *)&this_00->super_QLayout + 0x60))(this_00);
  QLayout::setContentsMargins(&this->gl->super_QLayout,left,left,left,left);
  pQVar3 = (QColorShowLabel *)operator_new(0x48);
  QColorShowLabel::QColorShowLabel(pQVar3,&this->super_QWidget);
  this->lab = pQVar3;
  QWidget::setMinimumWidth((QWidget *)pQVar3,0x3c);
  QGridLayout::addWidget(this->gl,(QWidget *)this->lab,0,0,-1,1,(Alignment)0x0);
  pQVar3 = this->lab;
  local_50 = newCol;
  local_48 = (ImplFn)0x0;
  local_78 = (QArrayData *)QColorShowLabel::colorDropped;
  local_70 = (char16_t *)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QCallableObject<void_(QtPrivate::QColorShower::*)(unsigned_int),_QtPrivate::List<unsigned_int>,_void>
       ::impl;
  *(code **)(puVar4 + 4) = newCol;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pQVar3,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_50,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pQVar3 = this->lab;
  local_50 = setRgb;
  local_48 = (ImplFn)0x0;
  local_78 = (QArrayData *)QColorShowLabel::colorDropped;
  local_70 = (char16_t *)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QCallableObject<void_(QtPrivate::QColorShower::*)(unsigned_int),_QtPrivate::List<unsigned_int>,_void>
       ::impl;
  *(code **)(puVar4 + 4) = setRgb;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_58,(void **)pQVar3,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_50,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  pQVar5 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar5,&this->super_QWidget);
  *(undefined ***)&(pQVar5->super_QAbstractSpinBox).super_QWidget = &PTR_metaObject_00800be0;
  *(undefined ***)&(pQVar5->super_QAbstractSpinBox).super_QWidget.super_QPaintDevice =
       &PTR__QColSpinBox_00800dd0;
  QSpinBox::setRange(pQVar5,0,0xff);
  this->hEd = (QColSpinBox *)pQVar5;
  QSpinBox::setRange(pQVar5,0,0x167);
  pQVar6 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar6,&this->super_QWidget,(WindowFlags)0x0);
  this->lblHue = pQVar6;
  QLabel::setBuddy(pQVar6,(QWidget *)this->hEd);
  QLabel::setAlignment(this->lblHue,(Alignment)0x82);
  QGridLayout::addWidget(this->gl,(QWidget *)this->lblHue,0,1,(Alignment)0x0);
  QGridLayout::addWidget(this->gl,(QWidget *)this->hEd,0,2,(Alignment)0x0);
  pQVar5 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar5,&this->super_QWidget);
  *(undefined ***)&(pQVar5->super_QAbstractSpinBox).super_QWidget = &PTR_metaObject_00800be0;
  *(undefined ***)&(pQVar5->super_QAbstractSpinBox).super_QWidget.super_QPaintDevice =
       &PTR__QColSpinBox_00800dd0;
  QSpinBox::setRange(pQVar5,0,0xff);
  this->sEd = (QColSpinBox *)pQVar5;
  pQVar6 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar6,&this->super_QWidget,(WindowFlags)0x0);
  this->lblSat = pQVar6;
  QLabel::setBuddy(pQVar6,(QWidget *)this->sEd);
  QLabel::setAlignment(this->lblSat,(Alignment)0x82);
  QGridLayout::addWidget(this->gl,(QWidget *)this->lblSat,1,1,(Alignment)0x0);
  QGridLayout::addWidget(this->gl,(QWidget *)this->sEd,1,2,(Alignment)0x0);
  pQVar5 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar5,&this->super_QWidget);
  *(undefined ***)&(pQVar5->super_QAbstractSpinBox).super_QWidget = &PTR_metaObject_00800be0;
  *(undefined ***)&(pQVar5->super_QAbstractSpinBox).super_QWidget.super_QPaintDevice =
       &PTR__QColSpinBox_00800dd0;
  QSpinBox::setRange(pQVar5,0,0xff);
  this->vEd = (QColSpinBox *)pQVar5;
  pQVar6 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar6,&this->super_QWidget,(WindowFlags)0x0);
  this->lblVal = pQVar6;
  QLabel::setBuddy(pQVar6,(QWidget *)this->vEd);
  QLabel::setAlignment(this->lblVal,(Alignment)0x82);
  QGridLayout::addWidget(this->gl,(QWidget *)this->lblVal,2,1,(Alignment)0x0);
  QGridLayout::addWidget(this->gl,(QWidget *)this->vEd,2,2,(Alignment)0x0);
  pQVar5 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar5,&this->super_QWidget);
  *(undefined ***)&(pQVar5->super_QAbstractSpinBox).super_QWidget = &PTR_metaObject_00800be0;
  *(undefined ***)&(pQVar5->super_QAbstractSpinBox).super_QWidget.super_QPaintDevice =
       &PTR__QColSpinBox_00800dd0;
  QSpinBox::setRange(pQVar5,0,0xff);
  this->rEd = (QColSpinBox *)pQVar5;
  pQVar6 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar6,&this->super_QWidget,(WindowFlags)0x0);
  this->lblRed = pQVar6;
  QLabel::setBuddy(pQVar6,(QWidget *)this->rEd);
  QLabel::setAlignment(this->lblRed,(Alignment)0x82);
  QGridLayout::addWidget(this->gl,(QWidget *)this->lblRed,0,3,(Alignment)0x0);
  QGridLayout::addWidget(this->gl,(QWidget *)this->rEd,0,4,(Alignment)0x0);
  pQVar5 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar5,&this->super_QWidget);
  *(undefined ***)&(pQVar5->super_QAbstractSpinBox).super_QWidget = &PTR_metaObject_00800be0;
  *(undefined ***)&(pQVar5->super_QAbstractSpinBox).super_QWidget.super_QPaintDevice =
       &PTR__QColSpinBox_00800dd0;
  QSpinBox::setRange(pQVar5,0,0xff);
  this->gEd = (QColSpinBox *)pQVar5;
  pQVar6 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar6,&this->super_QWidget,(WindowFlags)0x0);
  this->lblGreen = pQVar6;
  QLabel::setBuddy(pQVar6,(QWidget *)this->gEd);
  QLabel::setAlignment(this->lblGreen,(Alignment)0x82);
  QGridLayout::addWidget(this->gl,(QWidget *)this->lblGreen,1,3,(Alignment)0x0);
  QGridLayout::addWidget(this->gl,(QWidget *)this->gEd,1,4,(Alignment)0x0);
  pQVar5 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar5,&this->super_QWidget);
  *(undefined ***)&(pQVar5->super_QAbstractSpinBox).super_QWidget = &PTR_metaObject_00800be0;
  *(undefined ***)&(pQVar5->super_QAbstractSpinBox).super_QWidget.super_QPaintDevice =
       &PTR__QColSpinBox_00800dd0;
  QSpinBox::setRange(pQVar5,0,0xff);
  this->bEd = (QColSpinBox *)pQVar5;
  pQVar6 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar6,&this->super_QWidget,(WindowFlags)0x0);
  this->lblBlue = pQVar6;
  QLabel::setBuddy(pQVar6,(QWidget *)this->bEd);
  QLabel::setAlignment(this->lblBlue,(Alignment)0x82);
  QGridLayout::addWidget(this->gl,(QWidget *)this->lblBlue,2,3,(Alignment)0x0);
  QGridLayout::addWidget(this->gl,(QWidget *)this->bEd,2,4,(Alignment)0x0);
  pQVar5 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar5,&this->super_QWidget);
  *(undefined ***)&(pQVar5->super_QAbstractSpinBox).super_QWidget = &PTR_metaObject_00800be0;
  *(undefined ***)&(pQVar5->super_QAbstractSpinBox).super_QWidget.super_QPaintDevice =
       &PTR__QColSpinBox_00800dd0;
  QSpinBox::setRange(pQVar5,0,0xff);
  this->alphaEd = (QColSpinBox *)pQVar5;
  pQVar6 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar6,&this->super_QWidget,(WindowFlags)0x0);
  this->alphaLab = pQVar6;
  QLabel::setBuddy(pQVar6,(QWidget *)this->alphaEd);
  QLabel::setAlignment(this->alphaLab,(Alignment)0x82);
  QGridLayout::addWidget(this->gl,(QWidget *)this->alphaLab,3,1,1,3,(Alignment)0x0);
  QGridLayout::addWidget(this->gl,(QWidget *)this->alphaEd,3,4,(Alignment)0x0);
  QWidget::hide((QWidget *)this->alphaEd);
  QWidget::hide((QWidget *)this->alphaLab);
  pQVar6 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar6,&this->super_QWidget,(WindowFlags)0x0);
  this->lblHtml = pQVar6;
  this_01.m_data = operator_new(0x28);
  QLineEdit::QLineEdit((QLineEdit *)this_01.m_data,&this->super_QWidget);
  this->htEd = (QLineEdit *)this_01;
  QVar7.m_size = (size_t)"qt_colorname_lineedit";
  QVar7.field_0.m_data = this_01.m_data;
  QObject::setObjectName(QVar7);
  QLabel::setBuddy(this->lblHtml,&this->htEd->super_QWidget);
  _regExp = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = (QArrayData *)0x0;
  local_70 = L"#?([A-Fa-f0-9]{6}|[A-Fa-f0-9]{3})";
  local_68 = 0x21;
  QRegularExpression::QRegularExpression(&regExp,&local_78,0);
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,0x10);
    }
  }
  this_02 = (QRegularExpressionValidator *)operator_new(0x10);
  QRegularExpressionValidator::QRegularExpressionValidator(this_02,&regExp,(QObject *)this);
  QLineEdit::setValidator(this->htEd,(QValidator *)this_02);
  QWidget::setSizePolicy(&this->htEd->super_QWidget,(QSizePolicy)0x40000);
  QLabel::setAlignment(this->lblHtml,(Alignment)0x82);
  QGridLayout::addWidget(this->gl,(QWidget *)this->lblHtml,5,1,(Alignment)0x0);
  QGridLayout::addWidget(this->gl,&this->htEd->super_QWidget,5,2,1,3,(Alignment)0x0);
  pQVar1 = this->hEd;
  local_50 = hsvEd;
  local_48 = (ImplFn)0x0;
  local_78 = (QArrayData *)QSpinBox::valueChanged;
  local_70 = (char16_t *)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QCallableObject<void_(QtPrivate::QColorShower::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar4 + 4) = hsvEd;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_80,(void **)pQVar1,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_50,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  pQVar1 = this->sEd;
  local_50 = hsvEd;
  local_48 = (ImplFn)0x0;
  local_78 = (QArrayData *)QSpinBox::valueChanged;
  local_70 = (char16_t *)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QCallableObject<void_(QtPrivate::QColorShower::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar4 + 4) = hsvEd;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_88,(void **)pQVar1,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_50,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  pQVar1 = this->vEd;
  local_50 = hsvEd;
  local_48 = (ImplFn)0x0;
  local_78 = (QArrayData *)QSpinBox::valueChanged;
  local_70 = (char16_t *)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QCallableObject<void_(QtPrivate::QColorShower::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar4 + 4) = hsvEd;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_90,(void **)pQVar1,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_50,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  pQVar1 = this->rEd;
  local_50 = rgbEd;
  local_48 = (ImplFn)0x0;
  local_78 = (QArrayData *)QSpinBox::valueChanged;
  local_70 = (char16_t *)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QCallableObject<void_(QtPrivate::QColorShower::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar4 + 4) = rgbEd;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_98,(void **)pQVar1,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_50,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  pQVar1 = this->gEd;
  local_50 = rgbEd;
  local_48 = (ImplFn)0x0;
  local_78 = (QArrayData *)QSpinBox::valueChanged;
  local_70 = (char16_t *)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QCallableObject<void_(QtPrivate::QColorShower::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar4 + 4) = rgbEd;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_a0,(void **)pQVar1,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_50,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  pQVar1 = this->bEd;
  local_50 = rgbEd;
  local_48 = (ImplFn)0x0;
  local_78 = (QArrayData *)QSpinBox::valueChanged;
  local_70 = (char16_t *)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QCallableObject<void_(QtPrivate::QColorShower::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar4 + 4) = rgbEd;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_a8,(void **)pQVar1,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_50,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  pQVar1 = this->alphaEd;
  local_50 = rgbEd;
  local_48 = (ImplFn)0x0;
  local_78 = (QArrayData *)QSpinBox::valueChanged;
  local_70 = (char16_t *)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QCallableObject<void_(QtPrivate::QColorShower::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar4 + 4) = rgbEd;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_b0,(void **)pQVar1,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_50,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  pQVar2 = this->htEd;
  local_50 = htmlEd;
  local_48 = (ImplFn)0x0;
  local_78 = (QArrayData *)QLineEdit::textEdited;
  local_70 = (char16_t *)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QCallableObject<void_(QtPrivate::QColorShower::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar4 + 4) = htmlEd;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_b8,(void **)pQVar2,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_50,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_b8);
  retranslateStrings(this);
  QRegularExpression::~QRegularExpression(&regExp);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QColorShower::QColorShower(QColorDialog *parent)
    : QWidget(parent)
{
    colorDialog = parent;

    curCol = qRgb(255, 255, 255);
    curQColor = Qt::white;

    gl = new QGridLayout(this);
    const int s = gl->spacing();
    gl->setContentsMargins(s, s, s, s);
    lab = new QColorShowLabel(this);

#ifdef QT_SMALL_COLORDIALOG
    lab->setMinimumHeight(60);
#endif
    lab->setMinimumWidth(60);

// For QVGA screens only the comboboxes and color label are visible.
// For nHD screens only color and luminence pickers and color label are visible.
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lab, 0, 0, -1, 1);
#else
    gl->addWidget(lab, 0, 0, 1, -1);
#endif
    connect(lab, &QColorShowLabel::colorDropped, this, &QColorShower::newCol);
    connect(lab, &QColorShowLabel::colorDropped, this, &QColorShower::setRgb);

    hEd = new QColSpinBox(this);
    hEd->setRange(0, 359);
    lblHue = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblHue->setBuddy(hEd);
#endif
    lblHue->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblHue, 0, 1);
    gl->addWidget(hEd, 0, 2);
#else
    gl->addWidget(lblHue, 1, 0);
    gl->addWidget(hEd, 2, 0);
#endif

    sEd = new QColSpinBox(this);
    lblSat = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblSat->setBuddy(sEd);
#endif
    lblSat->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblSat, 1, 1);
    gl->addWidget(sEd, 1, 2);
#else
    gl->addWidget(lblSat, 1, 1);
    gl->addWidget(sEd, 2, 1);
#endif

    vEd = new QColSpinBox(this);
    lblVal = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblVal->setBuddy(vEd);
#endif
    lblVal->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblVal, 2, 1);
    gl->addWidget(vEd, 2, 2);
#else
    gl->addWidget(lblVal, 1, 2);
    gl->addWidget(vEd, 2, 2);
#endif

    rEd = new QColSpinBox(this);
    lblRed = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblRed->setBuddy(rEd);
#endif
    lblRed->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblRed, 0, 3);
    gl->addWidget(rEd, 0, 4);
#else
    gl->addWidget(lblRed, 3, 0);
    gl->addWidget(rEd, 4, 0);
#endif

    gEd = new QColSpinBox(this);
    lblGreen = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblGreen->setBuddy(gEd);
#endif
    lblGreen->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblGreen, 1, 3);
    gl->addWidget(gEd, 1, 4);
#else
    gl->addWidget(lblGreen, 3, 1);
    gl->addWidget(gEd, 4, 1);
#endif

    bEd = new QColSpinBox(this);
    lblBlue = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblBlue->setBuddy(bEd);
#endif
    lblBlue->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblBlue, 2, 3);
    gl->addWidget(bEd, 2, 4);
#else
    gl->addWidget(lblBlue, 3, 2);
    gl->addWidget(bEd, 4, 2);
#endif

    alphaEd = new QColSpinBox(this);
    alphaLab = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    alphaLab->setBuddy(alphaEd);
#endif
    alphaLab->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(alphaLab, 3, 1, 1, 3);
    gl->addWidget(alphaEd, 3, 4);
#else
    gl->addWidget(alphaLab, 1, 3, 3, 1);
    gl->addWidget(alphaEd, 4, 3);
#endif
    alphaEd->hide();
    alphaLab->hide();
    lblHtml = new QLabel(this);
    htEd = new QLineEdit(this);
    htEd->setObjectName("qt_colorname_lineedit");
#ifndef QT_NO_SHORTCUT
    lblHtml->setBuddy(htEd);
#endif

#if QT_CONFIG(regularexpression)
    QRegularExpression regExp(QStringLiteral("#?([A-Fa-f0-9]{6}|[A-Fa-f0-9]{3})"));
    QRegularExpressionValidator *validator = new QRegularExpressionValidator(regExp, this);
    htEd->setValidator(validator);
#else
    htEd->setReadOnly(true);
#endif
    htEd->setSizePolicy(QSizePolicy::Maximum, QSizePolicy::Fixed);

    lblHtml->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblHtml, 5, 0);
    gl->addWidget(htEd, 5, 1, 1, /*colspan=*/ 2);
#else
    gl->addWidget(lblHtml, 5, 1);
    gl->addWidget(htEd, 5, 2, 1, /*colspan=*/ 3);
#endif

    connect(hEd, &QSpinBox::valueChanged, this, &QColorShower::hsvEd);
    connect(sEd, &QSpinBox::valueChanged, this, &QColorShower::hsvEd);
    connect(vEd, &QSpinBox::valueChanged, this, &QColorShower::hsvEd);

    connect(rEd, &QSpinBox::valueChanged, this, &QColorShower::rgbEd);
    connect(gEd, &QSpinBox::valueChanged, this, &QColorShower::rgbEd);
    connect(bEd, &QSpinBox::valueChanged, this, &QColorShower::rgbEd);
    connect(alphaEd, &QSpinBox::valueChanged, this, &QColorShower::rgbEd);
    connect(htEd, &QLineEdit::textEdited, this, &QColorShower::htmlEd);

    retranslateStrings();
}